

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O3

void test_ADynArray_reserve_failure_noMemoryAvailable_fn(int _i)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  ulong *puVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  ulong local_68;
  char *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  code *local_38;
  ulong local_30;
  ulong local_28;
  undefined8 *local_20;
  
  local_48 = private_ACUtilsTest_ADynArray_realloc;
  pcStack_40 = private_ACUtilsTest_ADynArray_free;
  local_30 = 8;
  local_38 = private_ACUtilsTest_ADynArray_growStrategy;
  local_28 = 8;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  uStack_50 = 0x10b9c6;
  local_20 = (undefined8 *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,8);
  *local_20 = 0x3035353535353535;
  private_ACUtilsTest_ADynArray_reallocFailCounter = 0;
  private_ACUtilsTest_ADynArray_reallocFail = 1;
  uStack_50 = 0x10b9fd;
  bVar1 = private_ACUtils_ADynArray_reserve(&local_48,0x20,false,1);
  if (bVar1 != false) {
    local_68 = (ulong)bVar1;
    puVar4 = &local_68;
    local_60 = "false";
    pcVar3 = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar6 = 
    "private_ACUtils_ADynArray_reserve(&array, private_ACUtilsTest_ADynArray_capacityMax, false, sizeof(*(&array)->buffer)) == false"
    ;
    pcVar7 = 
    "private_ACUtils_ADynArray_reserve(&array, private_ACUtilsTest_ADynArray_capacityMax, false, sizeof(*(&array)->buffer))"
    ;
    iVar5 = 0x126;
    goto LAB_0010bc88;
  }
  uStack_50 = 0x10ba16;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x126);
  if (local_30 == 8) {
    uStack_50 = 0x10ba36;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x127);
    if (local_28 == 8) {
      uStack_50 = 0x10ba56;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x128);
      if (local_20 == (undefined8 *)0x0) {
        puVar4 = &local_58;
        pcVar3 = "Assertion \'_ck_x != NULL\' failed";
        pcVar2 = "Assertion \'%s\' failed: %s == %#x";
        pcVar6 = "(void*) array.buffer != NULL";
        pcVar7 = "(void*) array.buffer";
        iVar5 = 0x129;
LAB_0010bc88:
        uStack_50 = 0;
        local_58 = 0;
        *(code **)((long)puVar4 + -8) = test_ADynArray_reserve_failure_growStrategyNull_fn;
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,iVar5,pcVar3,pcVar2,pcVar6,pcVar7);
      }
      uStack_50 = 0x10ba76;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x129);
      lVar9 = 0;
      do {
        uVar8 = (ulong)*(char *)((long)local_20 + lVar9);
        if (uVar8 != 0x35) {
          local_60 = "\'5\'";
          pcVar6 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
          pcVar2 = "array.buffer[i] == \'5\'";
          pcVar3 = "array.buffer[i]";
          iVar5 = 299;
          local_58 = 0x35;
          goto LAB_0010bb27;
        }
        uStack_50 = 0x10ba96;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,299);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 7);
      uVar8 = (ulong)*(char *)((long)local_20 + 7);
      if (uVar8 == 0x30) {
        uStack_50 = 0x10bac4;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,300);
        if (local_38 != (code *)0x0) {
          uStack_50 = 0x10bae1;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x12d);
          uStack_50 = 0x10baea;
          (*pcStack_40)(local_20);
          return;
        }
        puVar4 = &local_58;
        pcVar3 = "Assertion \'_ck_x != NULL\' failed";
        pcVar2 = "Assertion \'%s\' failed: %s == %#x";
        pcVar6 = "(void*) array.growStrategy != NULL";
        pcVar7 = "(void*) array.growStrategy";
        iVar5 = 0x12d;
        goto LAB_0010bc88;
      }
      local_60 = "\'0\'";
      pcVar6 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
      pcVar2 = "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1] == \'0\'";
      pcVar3 = "array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1]";
      iVar5 = 300;
      local_58 = 0x30;
      goto LAB_0010bb27;
    }
    pcVar2 = "array.capacity == private_ACUtilsTest_ADynArray_capacityMin";
    pcVar3 = "array.capacity";
    iVar5 = 0x128;
    uVar8 = local_28;
  }
  else {
    pcVar2 = "array.size == private_ACUtilsTest_ADynArray_capacityMin";
    pcVar3 = "array.size";
    iVar5 = 0x127;
    uVar8 = local_30;
  }
  local_60 = "private_ACUtilsTest_ADynArray_capacityMin";
  pcVar6 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
  local_58 = 8;
LAB_0010bb27:
  uStack_50 = 0;
  local_68 = uVar8;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar5,"Assertion \'_ck_x == _ck_y\' failed",pcVar6,pcVar2,pcVar3);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_reserve_failure_noMemoryAvailable)
{
    size_t i;
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = private_ACUtilsTest_ADynArray_capacityMin;
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    array.capacity = private_ACUtilsTest_ADynArray_capacityMin;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    for(i = 0; i < array.size - 1; ++i)
        array.buffer[i] = '5';
    array.buffer[array.size - 1] = '0';
    private_ACUtilsTest_ADynArray_reallocFailCounter = 0;
    private_ACUtilsTest_ADynArray_reallocFail = true;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_reserve(&array, private_ACUtilsTest_ADynArray_capacityMax), false);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, private_ACUtilsTest_ADynArray_capacityMin);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, private_ACUtilsTest_ADynArray_capacityMin);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    for(i = 0; i < private_ACUtilsTest_ADynArray_capacityMin - 1; ++i)
        ACUTILSTEST_ASSERT_INT_EQ(array.buffer[i], '5');
    ACUTILSTEST_ASSERT_INT_EQ(array.buffer[private_ACUtilsTest_ADynArray_capacityMin - 1], '0');
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    array.deallocator(array.buffer);
}